

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_listener_register_sparc64(MemoryListener *listener,AddressSpace *as)

{
  uc_struct_conflict12 *puVar1;
  QTailQLink *pQVar2;
  FlatView *fv;
  FlatRange *pFVar3;
  FlatRange *fr;
  MemoryRegionSection MStack_68;
  
  listener->address_space = as;
  (listener->link).tqe_next = (MemoryListener *)0x0;
  (listener->link).tqe_circ.tql_prev = (as->uc->memory_listeners).tqh_circ.tql_prev;
  puVar1 = as->uc;
  ((puVar1->memory_listeners).tqh_circ.tql_prev)->tql_next = listener;
  (puVar1->memory_listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link;
  (listener->link_as).tqe_next = (MemoryListener *)0x0;
  pQVar2 = (as->listeners).tqh_circ.tql_prev;
  (listener->link_as).tqe_circ.tql_prev = pQVar2;
  pQVar2->tql_next = listener;
  (as->listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link_as;
  if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->begin)(listener);
  }
  fv = as->current_map;
  pFVar3 = fv->ranges;
  for (fr = pFVar3; fr < pFVar3 + fv->nr; fr = fr + 1) {
    section_from_flat_range(&MStack_68,fr,fv);
    if (listener->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
      (*listener->region_add)(listener,&MStack_68);
    }
    pFVar3 = fv->ranges;
  }
  if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->commit)(listener);
  }
  return;
}

Assistant:

void memory_listener_register(MemoryListener *listener, AddressSpace *as)
{
    listener->address_space = as;
    QTAILQ_INSERT_TAIL(&as->uc->memory_listeners, listener, link);
    QTAILQ_INSERT_TAIL(&as->listeners, listener, link_as);

    listener_add_address_space(listener, as);
}